

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
          (SourceTreeDescriptorDatabase *this,SourceTree *source_tree,
          DescriptorDatabase *fallback_database)

{
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__SourceTreeDescriptorDatabase_00471948;
  this->source_tree_ = source_tree;
  this->fallback_database_ = fallback_database;
  this->error_collector_ = (MultiFileErrorCollector *)0x0;
  this->using_validation_error_collector_ = false;
  SourceLocationTable::SourceLocationTable(&this->source_locations_);
  (this->validation_error_collector_).super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__ValidationErrorCollector_00471990;
  (this->validation_error_collector_).owner_ = this;
  return;
}

Assistant:

SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase(
    SourceTree* source_tree, DescriptorDatabase* fallback_database)
    : source_tree_(source_tree),
      fallback_database_(fallback_database),
      error_collector_(nullptr),
      using_validation_error_collector_(false),
      validation_error_collector_(this) {}